

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void jsonAppendString(JsonString *p,char *zIn,u32 N)

{
  char cVar1;
  u64 uVar2;
  int iVar3;
  uint in_EDX;
  char *in_RSI;
  JsonString *in_RDI;
  bool bVar4;
  u8 *z;
  u8 c;
  u32 k;
  char *local_28;
  undefined3 in_stack_ffffffffffffffe4;
  u32 N_00;
  uint uVar5;
  
  N_00 = CONCAT13(0xaa,in_stack_ffffffffffffffe4);
  if ((in_RSI == (char *)0x0) ||
     ((in_RDI->nAlloc <= (ulong)in_EDX + in_RDI->nUsed + 2 &&
      (iVar3 = jsonStringGrow((JsonString *)CONCAT44(in_EDX,0xaaaaaaaa),N_00), iVar3 != 0)))) {
    return;
  }
  uVar2 = in_RDI->nUsed;
  in_RDI->nUsed = uVar2 + 1;
  in_RDI->zBuf[uVar2] = '\"';
  local_28 = in_RSI;
  do {
    for (uVar5 = 0; uVar5 + 3 < in_EDX; uVar5 = uVar5 + 4) {
      if (""[(byte)local_28[uVar5]] == '\0') goto LAB_002372f0;
      if (""[(byte)local_28[uVar5 + 1]] == '\0') {
        uVar5 = uVar5 + 1;
        goto LAB_002372f0;
      }
      if (""[(byte)local_28[uVar5 + 2]] == '\0') {
        uVar5 = uVar5 + 2;
        goto LAB_002372f0;
      }
      if (""[(byte)local_28[uVar5 + 3]] == '\0') {
        uVar5 = uVar5 + 3;
        goto LAB_002372f0;
      }
    }
    while( true ) {
      bVar4 = false;
      if (uVar5 < in_EDX) {
        bVar4 = ""[(byte)local_28[uVar5]] != '\0';
      }
      if (!bVar4) break;
      uVar5 = uVar5 + 1;
    }
LAB_002372f0:
    if (in_EDX <= uVar5) {
      if (uVar5 != 0) {
        memcpy(in_RDI->zBuf + in_RDI->nUsed,local_28,(ulong)uVar5);
        in_RDI->nUsed = (ulong)uVar5 + in_RDI->nUsed;
      }
      uVar2 = in_RDI->nUsed;
      in_RDI->nUsed = uVar2 + 1;
      in_RDI->zBuf[uVar2] = '\"';
      return;
    }
    if (uVar5 != 0) {
      memcpy(in_RDI->zBuf + in_RDI->nUsed,local_28,(ulong)uVar5);
      in_RDI->nUsed = (ulong)uVar5 + in_RDI->nUsed;
      local_28 = local_28 + uVar5;
      in_EDX = in_EDX - uVar5;
    }
    cVar1 = *local_28;
    N_00 = CONCAT13(cVar1,(int3)N_00);
    if ((cVar1 == '\"') || (cVar1 == '\\')) {
      if ((in_RDI->nAlloc < in_RDI->nUsed + (ulong)in_EDX + 3) &&
         (iVar3 = jsonStringGrow((JsonString *)CONCAT44(in_EDX,uVar5),N_00), iVar3 != 0)) {
        return;
      }
      uVar2 = in_RDI->nUsed;
      in_RDI->nUsed = uVar2 + 1;
      in_RDI->zBuf[uVar2] = '\\';
      uVar2 = in_RDI->nUsed;
      in_RDI->nUsed = uVar2 + 1;
      in_RDI->zBuf[uVar2] = (char)(N_00 >> 0x18);
    }
    else if (cVar1 == '\'') {
      uVar2 = in_RDI->nUsed;
      in_RDI->nUsed = uVar2 + 1;
      in_RDI->zBuf[uVar2] = '\'';
    }
    else {
      if ((in_RDI->nAlloc < in_RDI->nUsed + (ulong)in_EDX + 7) &&
         (iVar3 = jsonStringGrow((JsonString *)CONCAT44(in_EDX,uVar5),N_00), iVar3 != 0)) {
        return;
      }
      jsonAppendControlChar(in_RDI,(u8)(N_00 >> 0x18));
    }
    local_28 = local_28 + 1;
    in_EDX = in_EDX - 1;
  } while( true );
}

Assistant:

static void jsonAppendString(JsonString *p, const char *zIn, u32 N){
  u32 k;
  u8 c;
  const u8 *z = (const u8*)zIn;
  if( z==0 ) return;
  if( (N+p->nUsed+2 >= p->nAlloc) && jsonStringGrow(p,N+2)!=0 ) return;
  p->zBuf[p->nUsed++] = '"';
  while( 1 /*exit-by-break*/ ){
    k = 0;
    /* The following while() is the 4-way unwound equivalent of
    **
    **     while( k<N && jsonIsOk[z[k]] ){ k++; }
    */
    while( 1 /* Exit by break */ ){
      if( k+3>=N ){
        while( k<N && jsonIsOk[z[k]] ){ k++; }
        break;
      }
      if( !jsonIsOk[z[k]] ){
        break;
      }
      if( !jsonIsOk[z[k+1]] ){
        k += 1;
        break;
      }
      if( !jsonIsOk[z[k+2]] ){
        k += 2;
        break;
      }
      if( !jsonIsOk[z[k+3]] ){
        k += 3;
        break;
      }else{
        k += 4;
      }
    }
    if( k>=N ){
      if( k>0 ){
        memcpy(&p->zBuf[p->nUsed], z, k);
        p->nUsed += k;
      }
      break;
    }
    if( k>0 ){
      memcpy(&p->zBuf[p->nUsed], z, k);
      p->nUsed += k;
      z += k;
      N -= k;
    }
    c = z[0];
    if( c=='"' || c=='\\' ){
      if( (p->nUsed+N+3 > p->nAlloc) && jsonStringGrow(p,N+3)!=0 ) return;
      p->zBuf[p->nUsed++] = '\\';
      p->zBuf[p->nUsed++] = c;
    }else if( c=='\'' ){
      p->zBuf[p->nUsed++] = c;
    }else{
      if( (p->nUsed+N+7 > p->nAlloc) && jsonStringGrow(p,N+7)!=0 ) return;
      jsonAppendControlChar(p, c);
    }
    z++;
    N--;
  }
  p->zBuf[p->nUsed++] = '"';
  assert( p->nUsed<p->nAlloc );
}